

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLElement * __thiscall tinyxml2::XMLNode::PreviousSiblingElement(XMLNode *this,char *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *q;
  XMLElement *this_00;
  
  while( true ) {
    do {
      this = this->_prev;
      if (this == (XMLNode *)0x0) {
        return (XMLElement *)0x0;
      }
      iVar2 = (*this->_vptr_XMLNode[6])(this);
      this_00 = (XMLElement *)CONCAT44(extraout_var,iVar2);
    } while (this_00 == (XMLElement *)0x0);
    if (name == (char *)0x0) break;
    q = Value((XMLNode *)this_00);
    bVar1 = XMLUtil::StringEqual(name,q,0x7fffffff);
    if (bVar1) {
      return this_00;
    }
  }
  return this_00;
}

Assistant:

const XMLElement* XMLNode::PreviousSiblingElement( const char* name ) const
{
    for( const XMLNode* node = _prev; node; node = node->_prev ) {
        const XMLElement* element = node->ToElement();
        if ( element
                && (!name || XMLUtil::StringEqual( name, element->Name() ))) {
            return element;
        }
    }
    return 0;
}